

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

Id dxil_spv::build_accumulate_offsets(Impl *impl,Id *ids,uint count)

{
  Id IVar1;
  Builder *pBVar2;
  Operation *this;
  Id arg;
  ulong uVar3;
  
  if (count == 0) {
    IVar1 = 0;
  }
  else {
    uVar3 = 0;
    arg = 0;
    do {
      IVar1 = arg;
      if ((ids[uVar3] != 0) && (IVar1 = ids[uVar3], arg != 0)) {
        pBVar2 = Converter::Impl::builder(impl);
        IVar1 = spv::Builder::makeIntegerType(pBVar2,0x20,false);
        this = Converter::Impl::allocate(impl,OpIAdd,IVar1);
        Operation::add_id(this,arg);
        Operation::add_id(this,ids[uVar3]);
        Converter::Impl::add(impl,this,false);
        IVar1 = this->id;
      }
      uVar3 = uVar3 + 1;
      arg = IVar1;
    } while (count != uVar3);
  }
  if (IVar1 == 0) {
    pBVar2 = Converter::Impl::builder(impl);
    IVar1 = spv::Builder::makeIntegerType(pBVar2,0x20,false);
    IVar1 = spv::Builder::makeIntConstant(pBVar2,IVar1,0,false);
    return IVar1;
  }
  return IVar1;
}

Assistant:

static spv::Id build_accumulate_offsets(Converter::Impl &impl, const spv::Id *ids, unsigned count)
{
	spv::Id accumulated_id = 0;
	for (unsigned i = 0; i < count; i++)
	{
		if (!ids[i])
			continue;

		if (!accumulated_id)
		{
			accumulated_id = ids[i];
		}
		else
		{
			auto *add_op = impl.allocate(spv::OpIAdd, impl.builder().makeUintType(32));
			add_op->add_id(accumulated_id);
			add_op->add_id(ids[i]);
			impl.add(add_op);
			accumulated_id = add_op->id;
		}
	}

	if (!accumulated_id)
		accumulated_id = impl.builder().makeUintConstant(0);

	return accumulated_id;
}